

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

string * el::base::utils::Str::replaceAll(string *str,char replaceWhat,char replaceWith)

{
  size_type sVar1;
  pointer pcVar2;
  size_type sVar3;
  
  sVar1 = str->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (str->_M_dataplus)._M_p;
    sVar3 = 0;
    do {
      if (pcVar2[sVar3] == replaceWhat) {
        pcVar2[sVar3] = replaceWith;
      }
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  return str;
}

Assistant:

std::string& Str::replaceAll(std::string& str, char replaceWhat, char replaceWith) {
  std::replace(str.begin(), str.end(), replaceWhat, replaceWith);
  return str;
}